

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall ON_NurbsCurve::Append(ON_NurbsCurve *this,ON_NurbsCurve *c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  double *__dest;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_a8;
  int local_a0;
  ON_NurbsCurve tmp;
  
  if (this->m_cv_count == 0) {
    operator=(this,c);
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
    return SUB41(iVar2,0);
  }
  if (((c->m_is_rat != 0) && (this->m_is_rat == 0)) && (bVar1 = MakeRational(this), !bVar1)) {
    return false;
  }
  iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(this);
  if (iVar3 < iVar2) {
    iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
    bVar1 = IncreaseDegree(this,iVar2);
    if (!bVar1) {
      return false;
    }
  }
  iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
  if (iVar3 < iVar2) {
    (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])(this);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  if ((this->m_is_rat == 0) || (c->m_is_rat != 0)) {
    iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
    iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(this);
    if ((iVar3 <= iVar2) && (bVar1 = IsClamped(c,0), bVar1)) {
      iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
      iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                        (this);
      if (iVar3 <= iVar2) {
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                          (this,0);
        if ((char)iVar2 == '\0') {
          return false;
        }
        iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(c,0);
        if ((char)iVar2 == '\0') {
          return false;
        }
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])
                          (this);
        iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
        if (iVar2 != iVar3) {
          return false;
        }
        if ((c->m_is_rat != 0) != (this->m_is_rat != 0)) {
          return false;
        }
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                          (this);
        iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
        if (iVar2 != iVar3) {
          return false;
        }
        iVar2 = 1;
        bVar1 = ClampEnd(this,1);
        if (!bVar1) {
          return false;
        }
        dVar11 = Weight(c,0);
        iVar3 = this->m_cv_count;
        dVar12 = Weight(this,iVar3 + -1);
        if (this->m_is_rat == 0) {
          dVar13 = 1.0;
        }
        else {
          dVar13 = dVar12 / dVar11;
        }
        dVar12 = (double)(~-(ulong)(dVar11 != dVar12) & 0x3ff0000000000000 |
                         (ulong)dVar13 & -(ulong)(dVar11 != dVar12));
        ReserveCVCapacity(this,(iVar3 + c->m_cv_count) * this->m_cv_stride);
        iVar3 = ON_KnotCount(this->m_order,c->m_cv_count + this->m_cv_count);
        ReserveKnotCapacity(this,iVar3);
        dVar11 = 0.0;
        local_a8 = 0.0;
        if (this->m_knot != (double *)0x0) {
          local_a8 = this->m_knot[(long)this->m_cv_count + -1];
        }
        if (c->m_knot != (double *)0x0) {
          dVar11 = c->m_knot[(long)c->m_order + -2];
        }
        iVar3 = KnotCount(c);
        local_a0 = KnotCount(this);
        __dest = this->m_cv + (long)this->m_cv_stride * ((long)this->m_cv_count + -1);
        if (this->m_cv == (double *)0x0) {
          __dest = (double *)0x0;
        }
        uVar6 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
        if (this->m_dim < 1) {
          uVar6 = 0;
        }
        for (lVar9 = (long)(c->m_order + -1); lVar9 < iVar3; lVar9 = lVar9 + 1) {
          if (c->m_knot == (double *)0x0) {
            dVar13 = 0.0;
          }
          else {
            dVar13 = c->m_knot[lVar9];
          }
          dVar13 = dVar13 + (local_a8 - dVar11);
          lVar7 = (long)local_a0;
          pdVar8 = this->m_knot + (lVar7 - this->m_order) + 1;
          if (*pdVar8 <= dVar13 && dVar13 != *pdVar8) {
            local_a0 = local_a0 + 1;
            this->m_knot[lVar7] = dVar13;
            __dest = __dest + this->m_cv_stride;
            this->m_cv_count = this->m_cv_count + 1;
          }
          pdVar8 = c->m_cv + (long)iVar2 * (long)c->m_cv_stride;
          if (c->m_cv == (double *)0x0) {
            pdVar8 = (double *)0x0;
          }
          memcpy(__dest,pdVar8,(long)(int)(uVar6 * 8));
          if ((dVar12 != 1.0) || (NAN(dVar12))) {
            for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
              __dest[uVar5] = __dest[uVar5] * dVar12;
            }
          }
          iVar2 = iVar2 + 1;
        }
        return true;
      }
    }
  }
  ON_NurbsCurve(&tmp,c);
  iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(this);
  bVar1 = IncreaseDegree(&tmp,iVar2);
  if (bVar1) {
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    bVar1 = ChangeDimension(&tmp,iVar2);
    if ((bVar1) &&
       ((((this->m_is_rat == 0 || (bVar1 = MakeRational(&tmp), bVar1)) &&
         (bVar1 = ClampEnd(&tmp,0), bVar1)) && ((this->m_is_rat != 0) == (tmp.m_is_rat != 0))))) {
      uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])
                        (this);
      uVar10 = 0;
      uVar6 = tmp.m_order - 1;
      if (tmp.m_order < 2) {
        uVar6 = uVar10;
      }
      if (uVar6 != uVar4) goto LAB_0054ccd1;
      iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                        (this);
      if ((tmp.m_dim == iVar2) && (bVar1 = IsClamped(&tmp,0), bVar1)) {
        bVar1 = Append(this,&tmp);
        uVar10 = (uint)bVar1;
        goto LAB_0054ccd1;
      }
    }
  }
  uVar10 = 0;
LAB_0054ccd1:
  ~ON_NurbsCurve(&tmp);
  return SUB41(uVar10,0);
}

Assistant:

bool ON_NurbsCurve::Append( const ON_NurbsCurve& c )
{
  bool rc = false;

  if ( CVCount() == 0 ) {
    *this = c;
    return IsValid()?true:false;
  }

  if ( c.IsRational() && !IsRational() ) {
    if ( !MakeRational() )
      return false;
  }
  if ( c.Degree() > Degree() ) {
    if ( !IncreaseDegree( c.Degree() ) )
      return false;
  }
  if ( c.Dimension() > Dimension() ) {
    if ( !ChangeDimension( c.Dimension() ) )
      return false;
  }

  if (    (IsRational() && !c.IsRational())
       || c.Degree() < Degree() 
       || !c.IsClamped(0) 
       || c.Dimension() < Dimension() ) 
  {
    ON_NurbsCurve tmp(c);
    if ( !tmp.IncreaseDegree( Degree() ) )
      return false;
    if ( !tmp.ChangeDimension( Dimension() ) )
      return false;
    if ( IsRational() ) {
      if ( !tmp.MakeRational() )
        return false;
    }
    if ( !tmp.ClampEnd(0) )
      return false;

    // make sure we don't reenter this scope
    if ( tmp.IsRational() != IsRational() )
      return false;
    if ( tmp.Degree() != Degree() )
      return false;
    if ( tmp.Dimension() != Dimension() )
      return false;
    if ( !tmp.IsClamped(0) )
      return false;
    return Append(tmp);
  }

  if (    IsValid() 
       && c.IsValid() 
       && Degree() == c.Degree() 
       && IsRational() == c.IsRational() 
       && Dimension() == c.Dimension() ) 
  {
    if ( !ClampEnd(1) )
      return false;
    const double w0 = c.Weight(0);
    const double w1 = Weight(CVCount()-1);
    double w = 1.0;
    if ( IsRational() && w0 != w1 ) {
      w = w1/w0;
    }
    ReserveCVCapacity( (CVCount()+c.CVCount())*m_cv_stride );
    ReserveKnotCapacity( ON_KnotCount(Order(),CVCount()+c.CVCount()) );
    const double dk = Knot(CVCount()-1) - c.Knot(c.Order()-2);


    //const int c_cv_count = c.CVCount();
    const int c_knot_count = c.KnotCount();
    int i0, i1, i2, j;

		// i0 and cv index into m_knot and m_cv respectively 
		i0 = KnotCount();
		double* cv = CV(CVCount() - 1);
		const int cv_dim = CVSize();
		const int sizeof_cv = cv_dim * sizeof(*cv);

		// i1 and i2 index c's knots and cvs respectively
		i2 = 1;
		for ( i1 = c.Order()-1; i1 < c_knot_count; i1++, i2++ ) {
			double knot = c.Knot(i1) + dk;
			// GBA 20-April-2017  Check for span collapse
			if (knot > m_knot[i0 - Order() + 1])
			{
				m_knot[i0++] = knot;
				cv += m_cv_stride;
				m_cv_count++;
			}
			memcpy(cv, c.CV(i2), sizeof_cv);
			if (w != 1.0) {
				for (j = 0; j < cv_dim; j++)
					cv[j] *= w;
			}	
		}

    rc = true;
  }
  return rc;
}